

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlChar * xmlSplitQName3(xmlChar *name,int *len)

{
  long lVar1;
  long lVar2;
  xmlChar xVar3;
  
  if ((len != (int *)0x0 && name != (xmlChar *)0x0) && (xVar3 = *name, xVar3 != ':')) {
    lVar2 = 0;
    while (xVar3 != '\0') {
      if (xVar3 == ':') {
        *len = (int)lVar2;
        return name + lVar2 + 1;
      }
      lVar1 = lVar2 + 1;
      lVar2 = lVar2 + 1;
      xVar3 = name[lVar1];
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlSplitQName3(const xmlChar *name, int *len) {
    int l = 0;

    if (name == NULL) return(NULL);
    if (len == NULL) return(NULL);

    /* nasty but valid */
    if (name[0] == ':')
	return(NULL);

    /*
     * we are not trying to validate but just to cut, and yes it will
     * work even if this is as set of UTF-8 encoded chars
     */
    while ((name[l] != 0) && (name[l] != ':'))
	l++;

    if (name[l] == 0)
	return(NULL);

    *len = l;

    return(&name[l+1]);
}